

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_socket(int domain,int protocol)

{
  int *piVar1;
  undefined4 in_ESI;
  int unaff_retaddr;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  nn_do_once((nn_once_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (_func_void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  nn_mutex_lock((nn_mutex_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if ((self.flags & 3U) == 0) {
    nn_global_init();
    iVar2 = nn_global_create_socket(unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar2 < 0) {
      nn_global_term();
      nn_mutex_unlock((nn_mutex_t *)CONCAT44(in_ESI,iVar2));
      iVar2 = -iVar2;
      piVar1 = __errno_location();
      *piVar1 = iVar2;
      iVar2 = -1;
    }
    else {
      nn_mutex_unlock((nn_mutex_t *)CONCAT44(in_ESI,iVar2));
    }
  }
  else {
    nn_mutex_unlock((nn_mutex_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    piVar1 = __errno_location();
    *piVar1 = 0x9523dfd;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_do_once (&once, nn_lib_init);

    nn_mutex_lock (&self.lock);

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_TERM)) {
        nn_mutex_unlock (&self.lock);
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_mutex_unlock (&self.lock);
        errno = -rc;
        return -1;
    }

    nn_mutex_unlock (&self.lock);

    return rc;
}